

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O2

void __thiscall MeCab::Param::Param(Param *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Param = (_func_int **)&PTR__Param_0016ba28;
  (this->conf_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->conf_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->conf_)._M_t._M_impl.super__Rb_tree_header;
  (this->conf_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->conf_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->conf_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->rest_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rest_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rest_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->system_name_)._M_dataplus._M_p = (pointer)&(this->system_name_).field_2;
  (this->system_name_)._M_string_length = 0;
  (this->system_name_).field_2._M_local_buf[0] = '\0';
  (this->help_)._M_dataplus._M_p = (pointer)&(this->help_).field_2;
  (this->help_)._M_string_length = 0;
  (this->help_).field_2._M_local_buf[0] = '\0';
  (this->version_)._M_dataplus._M_p = (pointer)&(this->version_).field_2;
  (this->version_)._M_string_length = 0;
  (this->version_).field_2._M_local_buf[0] = '\0';
  whatlog::whatlog(&this->what_);
  return;
}

Assistant:

explicit Param() {}